

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_rope_f16(ggml_compute_params *params,ggml_tensor *dst,bool forward)

{
  ushort *puVar1;
  ushort *puVar2;
  undefined2 *puVar3;
  long lVar4;
  long lVar5;
  float *cache;
  float ext_factor;
  float freq_scale;
  float fVar6;
  int32_t iVar7;
  float mscale;
  int32_t iVar8;
  float fVar9;
  float fVar10;
  uint uVar11;
  int32_t iVar12;
  ggml_tensor *pgVar13;
  ggml_tensor *pgVar14;
  ggml_tensor *pgVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  long ne0;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  size_t sVar23;
  size_t sVar24;
  void *pvVar25;
  void *pvVar26;
  void *pvVar27;
  void *pvVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  int iVar33;
  char *pcVar34;
  int iVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  undefined8 uVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int64_t i0_4;
  ulong uVar46;
  int64_t i0;
  long lVar47;
  ulong uVar48;
  float theta_scale;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  long local_210;
  long local_1f0;
  long local_1d8;
  float *local_1c0;
  long local_1a0;
  long local_190;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_140;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_e8;
  long local_e0;
  float corr_dims [2];
  int sections [4];
  
  ext_factor = (float)dst->op_params[7];
  freq_scale = (float)dst->op_params[6];
  pgVar13 = dst->src[1];
  fVar6 = (float)dst->op_params[5];
  pgVar14 = dst->src[0];
  iVar31 = dst->op_params[1];
  uVar46 = (ulong)iVar31;
  pgVar15 = dst->src[2];
  iVar7 = dst->op_params[9];
  mscale = (float)dst->op_params[8];
  uVar11 = dst->op_params[2];
  iVar12 = dst->op_params[4];
  sections._0_8_ = *(undefined8 *)(dst->op_params + 0xb);
  sections._8_8_ = *(undefined8 *)(dst->op_params + 0xd);
  iVar8 = dst->op_params[10];
  if (dst->nb[0] == 2) {
    sVar16 = pgVar14->nb[2];
    sVar17 = pgVar14->nb[3];
    sVar18 = pgVar14->nb[1];
    sVar19 = pgVar14->nb[0];
    ne0 = dst->ne[0];
    iVar30 = params->nth;
    uVar32 = dst->ne[1];
    uVar20 = dst->ne[2];
    uVar21 = dst->ne[3];
    sVar22 = dst->nb[1];
    sVar23 = dst->nb[2];
    sVar24 = dst->nb[3];
    iVar33 = params->ith;
    iVar29 = ggml_nrows(dst);
    if (ne0 < (long)uVar46) {
      pcVar34 = "n_dims <= ne0";
      uVar41 = 0x14c0;
    }
    else if ((uVar46 & 1) == 0) {
      iVar30 = (iVar30 + -1 + iVar29) / iVar30;
      iVar35 = iVar30 * iVar33;
      iVar30 = iVar30 + iVar35;
      if (iVar29 <= iVar30) {
        iVar30 = iVar29;
      }
      theta_scale = powf(fVar6,-2.0 / (float)iVar31);
      ggml_rope_yarn_corr_dims(fVar6,iVar7,iVar8,iVar31,iVar12,corr_dims);
      if (((((uVar11 & 8) == 0) || (0 < sections[0])) || (0 < sections[1])) || (0 < sections[2])) {
        local_168 = 2;
        if ((uVar11 == 0x18) && (ne0 / 2 != uVar46)) {
          pcVar34 = "n_dims == ne0/2";
          uVar41 = 0x14db;
        }
        else {
          if (pgVar15 == (ggml_tensor *)0x0) {
            local_1c0 = (float *)0x0;
LAB_0013b3f8:
            local_170 = (long)(iVar31 >> 1) * 2;
            local_180 = 0;
            local_1a0 = 0;
            uVar42 = 0;
            pvVar25 = pgVar13->data;
            lVar43 = (ne0 + 0x10) * (long)iVar33;
            fVar6 = (float)((uint)forward * 0x3f800000 + (uint)!forward * -0x40800000);
            uVar32 = ~((long)uVar32 >> 0x3f) & uVar32;
            lVar4 = lVar43 * 4;
            lVar5 = lVar4 + 4;
            local_190 = uVar46 * 2;
            lVar39 = sVar19 * uVar46 + 2;
            iVar31 = 0;
            local_178 = local_190;
            do {
              if (uVar42 == (~((long)uVar21 >> 0x3f) & uVar21)) {
                return;
              }
              local_110 = local_168;
              local_118 = local_178;
              local_120 = local_190;
              local_128 = local_170;
              local_130 = local_180;
              local_140 = local_1a0;
              local_108 = lVar39;
              for (uVar38 = 0; uVar38 != (~((long)uVar20 >> 0x3f) & uVar20); uVar38 = uVar38 + 1) {
                pvVar26 = params->wdata;
                cache = (float *)((long)pvVar26 + lVar43 * 4);
                iVar33 = *(int *)((long)pvVar25 + uVar38 * 4);
                if ((uVar11 & 8) == 0) {
                  ggml_rope_cache_init
                            ((float)iVar33,freq_scale,local_1c0,corr_dims,ne0,ext_factor,mscale,
                             cache,fVar6,theta_scale);
                }
                else {
                  ggml_mrope_cache_init
                            ((float)iVar33,(float)*(int *)((long)pvVar25 + uVar20 * 4 + uVar38 * 4),
                             (float)*(int *)((long)pvVar25 + uVar20 * 8 + uVar38 * 4),
                             (float)*(int *)((long)pvVar25 + uVar20 * 0xc + uVar38 * 4),sections,
                             uVar11 == 0x18,freq_scale,local_1c0,corr_dims,ne0,ext_factor,mscale,
                             cache,fVar6,theta_scale);
                }
                iVar29 = (int)uVar32 + iVar31;
                local_1d8 = local_108;
                local_1f0 = local_110;
                local_e0 = local_118;
                local_e8 = local_128;
                local_210 = local_130;
                lVar44 = local_140;
                lVar45 = local_120;
                iVar33 = iVar31;
                for (uVar36 = 0; iVar31 = iVar29, uVar36 != uVar32; uVar36 = uVar36 + 1) {
                  iVar31 = iVar33 + 1;
                  if (iVar35 <= iVar33) {
                    if (iVar30 <= iVar33) break;
                    if ((uVar11 & 10) == 0) {
                      lVar37 = local_1f0;
                      for (lVar40 = 0; lVar40 < (long)uVar46; lVar40 = lVar40 + 2) {
                        fVar9 = *(float *)((long)pvVar26 + lVar40 * 4 + lVar5);
                        fVar10 = *(float *)((long)pvVar26 + lVar40 * 4 + lVar4);
                        lVar47 = lVar37 + -2;
                        puVar1 = (ushort *)((long)pgVar14->data + lVar37);
                        lVar37 = lVar37 + sVar19 * 2;
                        auVar50 = vfmsub231ss_fma(ZEXT416((uint)(fVar9 * *(float *)(&
                                                  ggml_table_f32_f16 + (ulong)*puVar1 * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)*(ushort *)
                                                                           ((long)pgVar14->data +
                                                                           lVar47) * 4)),
                                                  ZEXT416((uint)fVar10));
                        auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * *(float *)(&
                                                  ggml_table_f32_f16 + (ulong)*puVar1 * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)*(ushort *)
                                                                           ((long)pgVar14->data +
                                                                           lVar47) * 4)),
                                                  ZEXT416((uint)fVar9));
                        auVar50 = vcvtps2ph_f16c(auVar50,0);
                        auVar49 = vcvtps2ph_f16c(auVar49,0);
                        auVar49 = vpunpcklwd_avx(auVar50,auVar49);
                        *(int *)((long)dst->data + lVar40 * 2 + lVar44) = auVar49._0_4_;
                      }
                    }
                    else if (uVar11 == 0x18) {
                      lVar37 = local_e0;
                      lVar40 = local_210;
                      for (lVar47 = 0; lVar47 < (long)uVar46; lVar47 = lVar47 + 2) {
                        fVar9 = *(float *)((long)pvVar26 + lVar47 * 4 + lVar5);
                        fVar10 = *(float *)((long)pvVar26 + lVar47 * 4 + lVar4);
                        puVar1 = (ushort *)((long)pgVar14->data + lVar40);
                        puVar2 = (ushort *)((long)pgVar14->data + lVar37);
                        lVar40 = lVar40 + sVar19;
                        lVar37 = lVar37 + sVar19;
                        auVar50 = vfmsub231ss_fma(ZEXT416((uint)(fVar9 * *(float *)(&
                                                  ggml_table_f32_f16 + (ulong)*puVar2 * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)*puVar1 * 4)),
                                                  ZEXT416((uint)fVar10));
                        auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * *(float *)(&
                                                  ggml_table_f32_f16 + (ulong)*puVar2 * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)*puVar1 * 4)),
                                                  ZEXT416((uint)fVar9));
                        auVar50 = vcvtps2ph_f16c(auVar50,0);
                        auVar49 = vcvtps2ph_f16c(auVar49,0);
                        vpextrw_avx(auVar50,0);
                        vpextrw_avx(auVar49,0);
                      }
                    }
                    else {
                      lVar37 = local_e8;
                      lVar40 = local_210;
                      for (lVar47 = 0; lVar47 < (long)uVar46; lVar47 = lVar47 + 2) {
                        fVar9 = *(float *)((long)pvVar26 + lVar47 * 4 + lVar5);
                        fVar10 = *(float *)((long)pvVar26 + lVar47 * 4 + lVar4);
                        puVar1 = (ushort *)((long)pgVar14->data + lVar40);
                        puVar2 = (ushort *)((long)pgVar14->data + lVar37);
                        lVar40 = lVar40 + sVar19;
                        lVar37 = lVar37 + sVar19;
                        auVar50 = vfmsub231ss_fma(ZEXT416((uint)(fVar9 * *(float *)(&
                                                  ggml_table_f32_f16 + (ulong)*puVar2 * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)*puVar1 * 4)),
                                                  ZEXT416((uint)fVar10));
                        auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * *(float *)(&
                                                  ggml_table_f32_f16 + (ulong)*puVar2 * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)*puVar1 * 4)),
                                                  ZEXT416((uint)fVar9));
                        auVar50 = vcvtps2ph_f16c(auVar50,0);
                        vpextrw_avx(auVar50,0);
                        auVar49 = vcvtps2ph_f16c(auVar49,0);
                        vpextrw_avx(auVar49,0);
                      }
                    }
                    lVar37 = local_1d8;
                    lVar40 = lVar45;
                    uVar48 = uVar46;
                    if (uVar11 == 0x18) {
                      while ((long)uVar48 < ne0) {
                        lVar40 = (long)uVar48 >> 1;
                        fVar9 = *(float *)((long)pvVar26 + uVar48 * 4 + lVar5);
                        fVar10 = *(float *)((long)pvVar26 + uVar48 * 4 + lVar4);
                        uVar48 = uVar48 + 2;
                        lVar40 = lVar40 * sVar19;
                        lVar37 = uVar36 * sVar18 + uVar38 * sVar16 + uVar42 * sVar17;
                        auVar50 = vfmsub231ss_fma(ZEXT416((uint)(fVar9 * *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgVar14->data +
                                                          uVar46 * 2 + lVar40 + lVar37) * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)*(ushort *)
                                                                           ((long)pgVar14->data +
                                                                           lVar40 + lVar37) * 4)),
                                                  ZEXT416((uint)fVar10));
                        auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgVar14->data +
                                                          uVar46 * 2 + lVar40 + lVar37) * 4))),
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)*(ushort *)
                                                                           ((long)pgVar14->data +
                                                                           lVar40 + lVar37) * 4)),
                                                  ZEXT416((uint)fVar9));
                        auVar50 = vcvtps2ph_f16c(auVar50,0);
                        auVar49 = vcvtps2ph_f16c(auVar49,0);
                        vpextrw_avx(auVar50,0);
                        vpextrw_avx(auVar49,0);
                      }
                    }
                    else {
                      for (; (long)uVar48 < ne0; uVar48 = uVar48 + 2) {
                        pvVar27 = pgVar14->data;
                        pvVar28 = dst->data;
                        *(undefined2 *)((long)pvVar28 + lVar40) =
                             *(undefined2 *)((long)pvVar27 + lVar37 + -2);
                        puVar3 = (undefined2 *)((long)pvVar27 + lVar37);
                        lVar37 = lVar37 + sVar19 * 2;
                        *(undefined2 *)((long)pvVar28 + lVar40 + 2) = *puVar3;
                        lVar40 = lVar40 + 4;
                      }
                    }
                  }
                  local_210 = local_210 + sVar18;
                  local_e8 = local_e8 + sVar18;
                  local_e0 = local_e0 + sVar18;
                  local_1f0 = local_1f0 + sVar18;
                  local_1d8 = local_1d8 + sVar18;
                  lVar44 = lVar44 + sVar22;
                  lVar45 = lVar45 + sVar22;
                  iVar33 = iVar31;
                }
                local_140 = local_140 + sVar23;
                local_130 = local_130 + sVar16;
                local_128 = local_128 + sVar16;
                local_120 = local_120 + sVar23;
                local_118 = local_118 + sVar16;
                local_110 = local_110 + sVar16;
                local_108 = local_108 + sVar16;
              }
              uVar42 = uVar42 + 1;
              local_1a0 = local_1a0 + sVar24;
              local_180 = local_180 + sVar17;
              local_170 = local_170 + sVar17;
              local_190 = local_190 + sVar24;
              local_178 = local_178 + sVar17;
              local_168 = local_168 + sVar17;
              lVar39 = lVar39 + sVar17;
            } while( true );
          }
          if (pgVar15->type == GGML_TYPE_F32) {
            if ((long)(iVar31 >> 1) <= pgVar15->ne[0]) {
              local_1c0 = (float *)pgVar15->data;
              goto LAB_0013b3f8;
            }
            pcVar34 = "src2->ne[0] >= n_dims / 2";
            uVar41 = 0x14e1;
          }
          else {
            pcVar34 = "src2->type == GGML_TYPE_F32";
            uVar41 = 0x14e0;
          }
        }
      }
      else {
        pcVar34 = "sections[0] > 0 || sections[1] > 0 || sections[2] > 0";
        uVar41 = 0x14d7;
      }
    }
    else {
      pcVar34 = "n_dims % 2 == 0";
      uVar41 = 0x14c1;
    }
  }
  else {
    pcVar34 = "nb0 == sizeof(ggml_fp16_t)";
    uVar41 = 0x14b9;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar41,"GGML_ASSERT(%s) failed",pcVar34);
}

Assistant:

static void ggml_compute_forward_rope_f16(
        const ggml_compute_params * params,
        ggml_tensor * dst,
        const bool forward) {

    const ggml_tensor * src0 = dst->src[0];
    const ggml_tensor * src1 = dst->src[1];
    const ggml_tensor * src2 = dst->src[2];

    float freq_base, freq_scale, ext_factor, attn_factor, beta_fast, beta_slow;
    int sections[4];

    //const int n_past     = ((int32_t *) dst->op_params)[0];
    const int n_dims     = ((int32_t *) dst->op_params)[1];
    const int mode       = ((int32_t *) dst->op_params)[2];
    //const int n_ctx      = ((int32_t *) dst->op_params)[3];
    const int n_ctx_orig = ((int32_t *) dst->op_params)[4];
    memcpy(&freq_base,   (int32_t *) dst->op_params +  5, sizeof(float));
    memcpy(&freq_scale,  (int32_t *) dst->op_params +  6, sizeof(float));
    memcpy(&ext_factor,  (int32_t *) dst->op_params +  7, sizeof(float));
    memcpy(&attn_factor, (int32_t *) dst->op_params +  8, sizeof(float));
    memcpy(&beta_fast,   (int32_t *) dst->op_params +  9, sizeof(float));
    memcpy(&beta_slow,   (int32_t *) dst->op_params + 10, sizeof(float));
    memcpy(&sections,    (int32_t *) dst->op_params + 11, sizeof(int)*4);


    GGML_TENSOR_UNARY_OP_LOCALS

    //printf("ne0: %d, ne1: %d, ne2: %d, ne3: %d\n", ne0, ne1, ne2, ne3);
    //printf("n_past = %d, ne2 = %d\n", n_past, ne2);

    GGML_ASSERT(nb0 == sizeof(ggml_fp16_t));

    const int ith = params->ith;
    const int nth = params->nth;

    const int nr = ggml_nrows(dst);

    GGML_ASSERT(n_dims <= ne0);
    GGML_ASSERT(n_dims % 2 == 0);

    // rows per thread
    const int dr = (nr + nth - 1)/nth;

    // row range for this thread
    const int ir0 = dr*ith;
    const int ir1 = MIN(ir0 + dr, nr);

    // row index used to determine which thread to use
    int ir = 0;

    const float theta_scale = powf(freq_base, -2.0f/n_dims);

    float corr_dims[2];
    ggml_rope_yarn_corr_dims(n_dims, n_ctx_orig, freq_base, beta_fast, beta_slow, corr_dims);

    const bool is_neox = mode & GGML_ROPE_TYPE_NEOX;
    const bool is_mrope = mode & GGML_ROPE_TYPE_MROPE;
    const bool is_vision = mode == GGML_ROPE_TYPE_VISION;

    if (is_mrope) {
        GGML_ASSERT(sections[0] > 0 || sections[1] > 0 || sections[2] > 0);
    }

    if (is_vision) {
        GGML_ASSERT(n_dims == ne0/2);
    }

    const float * freq_factors = NULL;
    if (src2 != NULL) {
        GGML_ASSERT(src2->type == GGML_TYPE_F32);
        GGML_ASSERT(src2->ne[0] >= n_dims / 2);
        freq_factors = (const float *) src2->data;
    }

    // backward process uses inverse rotation by cos and sin.
    // cos and sin build a rotation matrix, where the inverse is the transpose.
    // this essentially just switches the sign of sin.
    const float sin_sign = forward ? 1.0f : -1.0f;

    const int32_t * pos = (const int32_t *) src1->data;

    for (int64_t i3 = 0; i3 < ne3; i3++) {
        for (int64_t i2 = 0; i2 < ne2; i2++) {

            float * cache = (float *) params->wdata + (ne0 + CACHE_LINE_SIZE_F32)*ith;
            if (!is_mrope) {
                const int64_t p = pos[i2];
                ggml_rope_cache_init(p, freq_scale, freq_factors, corr_dims, ne0, ext_factor, attn_factor, cache, sin_sign, theta_scale);
            }
            else {
                const int64_t p_t = pos[i2];
                const int64_t p_h = pos[i2 + ne2];
                const int64_t p_w = pos[i2 + ne2 * 2];
                const int64_t p_e = pos[i2 + ne2 * 3];
                ggml_mrope_cache_init(
                    p_t, p_h, p_w, p_e, sections, is_vision,
                    freq_scale, freq_factors, corr_dims, ne0, ext_factor, attn_factor, cache, sin_sign, theta_scale);
            }

            for (int64_t i1 = 0; i1 < ne1; i1++) {
                if (ir++ < ir0) continue;
                if (ir   > ir1) break;

                if (is_neox || is_mrope) {
                    if (is_vision) {
                        for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                            const int64_t ic = i0/2;

                            const float cos_theta = cache[i0 + 0];
                            const float sin_theta = cache[i0 + 1];

                            const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                            ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                            const float x0 = GGML_FP16_TO_FP32(src[0]);
                            const float x1 = GGML_FP16_TO_FP32(src[n_dims]);

                            dst_data[0]      = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                            dst_data[n_dims] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                        }
                    } else {
                        for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                            const int64_t ic = i0/2;

                            const float cos_theta = cache[i0 + 0];
                            const float sin_theta = cache[i0 + 1];

                            const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                            ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                            const float x0 = GGML_FP16_TO_FP32(src[0]);
                            const float x1 = GGML_FP16_TO_FP32(src[n_dims/2]);

                            dst_data[0]        = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                            dst_data[n_dims/2] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                        }
                    }
                } else {
                    for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                        const float cos_theta = cache[i0 + 0];
                        const float sin_theta = cache[i0 + 1];

                        const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + i0*nb00);
                              ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + i0*nb0);

                        const float x0 = GGML_FP16_TO_FP32(src[0]);
                        const float x1 = GGML_FP16_TO_FP32(src[1]);

                        dst_data[0] = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                        dst_data[1] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                    }
                }

                if (is_vision) {
                    for (int64_t i0 = n_dims; i0 < ne0; i0 += 2) {
                        const int64_t ic = i0/2;

                        const float cos_theta = cache[i0 + 0];
                        const float sin_theta = cache[i0 + 1];

                        const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                        ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                        const float x0 = GGML_FP16_TO_FP32(src[0]);
                        const float x1 = GGML_FP16_TO_FP32(src[n_dims]);

                        dst_data[0]      = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                        dst_data[n_dims] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                    }
                } else {
                    for (int64_t i0 = n_dims; i0 < ne0; i0 += 2) {
                        const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + i0*nb00);
                        ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + i0*nb0);

                        dst_data[0] = src[0];
                        dst_data[1] = src[1];
                    }
                }
            }
        }
    }
}